

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMReadWriteGraphBuilder.h
# Opt level: O0

ReadWriteGraph * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::build(LLVMReadWriteGraphBuilder *this)

{
  bool bVar1;
  LLVMPointerAnalysisOptions *this_00;
  PointerAnalysis *this_01;
  PointerGraph *this_02;
  Module *Str;
  GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *this_03;
  RWSubgraph *e;
  GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *in_RDI;
  StringRef SVar2;
  Function *entry;
  CallGraph CG;
  DGLLVMPointerAnalysis *dgpta;
  CallGraph *in_stack_ffffffffffffffb8;
  GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *in_stack_ffffffffffffffc0;
  ReadWriteGraph *this_04;
  CallGraph *in_stack_ffffffffffffffd0;
  Function *in_stack_ffffffffffffffd8;
  
  this_00 = LLVMPointerAnalysis::getOptions((LLVMPointerAnalysis *)in_RDI[1]._module);
  bVar1 = LLVMPointerAnalysisOptions::isSVF(this_00);
  if (bVar1) {
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildFromLLVM
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  else {
    this_01 = DGLLVMPointerAnalysis::getPTA((DGLLVMPointerAnalysis *)0x1a5296);
    this_02 = pta::PointerAnalysis::getPG(this_01);
    pta::PointerGraph::getCallGraph(this_02);
    llvmdg::CallGraph::CallGraph
              (in_stack_ffffffffffffffd0,(GenericCallGraph<dg::pta::PSNode_*> *)in_RDI);
    GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::buildFromLLVM
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    llvmdg::CallGraph::~CallGraph((CallGraph *)0x1a52cc);
  }
  Str = GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getModule(in_RDI);
  llvm::StringRef::StringRef((StringRef *)in_stack_ffffffffffffffc0,(string *)Str);
  SVar2.Length = (size_t)in_stack_ffffffffffffffd0;
  SVar2.Data = (char *)Str;
  this_03 = (GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph> *)
            llvm::Module::getFunction(SVar2);
  this_04 = (ReadWriteGraph *)&in_RDI[1]._subgraphs._M_h._M_bucket_count;
  e = GraphBuilder<dg::dda::RWNode,_dg::dda::RWBBlock,_dg::dda::RWSubgraph>::getSubgraph
                (this_03,in_stack_ffffffffffffffd8);
  ReadWriteGraph::setEntry(this_04,e);
  return (ReadWriteGraph *)&in_RDI[1]._subgraphs._M_h._M_bucket_count;
}

Assistant:

ReadWriteGraph &&build() {
        // FIXME: this is a bit of a hack
        if (!PTA->getOptions().isSVF()) {
            auto *dgpta = static_cast<DGLLVMPointerAnalysis *>(PTA);
            llvmdg::CallGraph CG(dgpta->getPTA()->getPG()->getCallGraph());
            buildFromLLVM(&CG);
        } else {
            buildFromLLVM();
        }

        auto *entry = getModule()->getFunction(_options.entryFunction);
        assert(entry && "Did not find the entry function");
        graph.setEntry(getSubgraph(entry));

        return std::move(graph);
    }